

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O2

void de::cmdline::detail::Parser::dispatchParse<tcu::opt::CrashHandler>
               (OptInfo *info,char *src,TypedFieldMap *dst)

{
  ValueType *value;
  void *pvVar1;
  
  value = (ValueType *)operator_new(1);
  *value = false;
  if (info->parse == (GenericParseFunc)0x0) {
    pvVar1 = findNamedValueMatch(src,info->namedValues,info->namedValuesEnd,info->namedValueStride);
    *value = *(ValueType *)((long)pvVar1 + 8);
  }
  else {
    (*info->parse)(src,value);
  }
  TypedFieldMap::set<tcu::opt::CrashHandler>(dst,value);
  return;
}

Assistant:

void Parser::dispatchParse (const OptInfo* info, const char* src, TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		DE_ASSERT((!!info->parse) != (!!info->namedValues));
		if (info->parse)
		{
			((typename Option<OptType>::ParseFunc)(info->parse))(src, value);
		}
		else
		{
			const void* match = findNamedValueMatch(src, info->namedValues, info->namedValuesEnd, info->namedValueStride);
			*value = static_cast<const NamedValue<typename OptTraits<OptType>::ValueType>*>(match)->value;
		}
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}